

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComponentManager.cpp
# Opt level: O0

ModuleInfo * __thiscall ComponentManager::getModInfo(ComponentManager *this,char *name)

{
  bool bVar1;
  ModuleInfo **ppMVar2;
  int local_9c;
  undefined1 local_98 [16];
  iterator i;
  allocator<char> local_71;
  string local_70;
  undefined1 local_50 [8];
  ModuleInfo match;
  char *name_local;
  ComponentManager *this_local;
  
  match.mHandle = name;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,name,&local_71);
  ModuleInfo::ModuleInfo((ModuleInfo *)local_50,&local_70,(IModule *)0x0,(void *)0x0);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  JetHead::list<ComponentManager::ModuleInfo_*>::begin
            ((list<ComponentManager::ModuleInfo_*> *)(local_98 + 8));
  do {
    JetHead::list<ComponentManager::ModuleInfo_*>::end
              ((list<ComponentManager::ModuleInfo_*> *)local_98);
    bVar1 = JetHead::list<ComponentManager::ModuleInfo_*>::iterator::operator!=
                      ((iterator *)(local_98 + 8),(iterator *)local_98);
    JetHead::list<ComponentManager::ModuleInfo_*>::iterator::~iterator((iterator *)local_98);
    if (!bVar1) {
      local_9c = 2;
LAB_00104e3e:
      JetHead::list<ComponentManager::ModuleInfo_*>::iterator::~iterator((iterator *)(local_98 + 8))
      ;
      if (local_9c == 2) {
        this_local = (ComponentManager *)0x0;
      }
      ModuleInfo::~ModuleInfo((ModuleInfo *)local_50);
      return (ModuleInfo *)this_local;
    }
    ppMVar2 = JetHead::list<ComponentManager::ModuleInfo_*>::iterator::operator*
                        ((iterator *)(local_98 + 8));
    bVar1 = ModuleInfo::operator==(*ppMVar2,(ModuleInfo *)local_50);
    if (bVar1) {
      ppMVar2 = JetHead::list<ComponentManager::ModuleInfo_*>::iterator::operator*
                          ((iterator *)(local_98 + 8));
      this_local = (ComponentManager *)*ppMVar2;
      local_9c = 1;
      goto LAB_00104e3e;
    }
    JetHead::list<ComponentManager::ModuleInfo_*>::iterator::operator++((iterator *)(local_98 + 8));
  } while( true );
}

Assistant:

ComponentManager::ModuleInfo *ComponentManager::getModInfo( const char *name )
{
	ModuleInfo match( name );

	for (JetHead::list<ModuleInfo*>::iterator i = mModules.begin(); 
		 i != mModules.end(); ++i)
	{
		if (*(*i) == match)
			return *i;
	}
	
	return NULL;
}